

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall capnp::compiler::NodeTranslator::StructLayout::Top::addData(Top *this,uint lgSize)

{
  undefined8 in_RAX;
  uint uVar1;
  char local_28 [4];
  uint local_24;
  
  _local_28 = in_RAX;
  HoleSet<unsigned_int>::tryAllocate((HoleSet<unsigned_int> *)local_28,(uint)&this->holes);
  if (local_28[0] == '\x01') {
    uVar1 = local_24;
  }
  else {
    uVar1 = this->dataWordCount;
    this->dataWordCount = uVar1 + 1;
    uVar1 = uVar1 << (6U - (char)lgSize & 0x1f);
    HoleSet<unsigned_int>::addHolesAtEnd(&this->holes,lgSize,uVar1 + 1,6);
  }
  return uVar1;
}

Assistant:

uint addData(uint lgSize) override {
      KJ_IF_MAYBE(hole, holes.tryAllocate(lgSize)) {
        return *hole;
      } else {
        uint offset = dataWordCount++ << (6 - lgSize);
        holes.addHolesAtEnd(lgSize, offset + 1);
        return offset;
      }